

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.c
# Opt level: O1

void ZopfliInitBlockState
               (ZopfliOptions *options,size_t blockstart,size_t blockend,int add_lmc,
               ZopfliBlockState *s)

{
  ZopfliLongestMatchCache *lmc;
  
  s->options = options;
  s->blockstart = blockstart;
  s->blockend = blockend;
  if (add_lmc != 0) {
    lmc = (ZopfliLongestMatchCache *)malloc(0x18);
    s->lmc = lmc;
    ZopfliInitCache(blockend - blockstart,lmc);
    return;
  }
  s->lmc = (ZopfliLongestMatchCache *)0x0;
  return;
}

Assistant:

void ZopfliInitBlockState(const ZopfliOptions* options,
                          size_t blockstart, size_t blockend, int add_lmc,
                          ZopfliBlockState* s) {
  s->options = options;
  s->blockstart = blockstart;
  s->blockend = blockend;
#ifdef ZOPFLI_LONGEST_MATCH_CACHE
  if (add_lmc) {
    s->lmc = (ZopfliLongestMatchCache*)malloc(sizeof(ZopfliLongestMatchCache));
    ZopfliInitCache(blockend - blockstart, s->lmc);
  } else {
    s->lmc = 0;
  }
#endif
}